

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Char * getContext(XML_Parser parser)

{
  XML_Char XVar1;
  XML_Char *pXVar2;
  bool bVar3;
  XML_Bool XVar4;
  NAMED *pNVar5;
  ENTITY *e;
  XML_Char *s_1;
  PREFIX *prefix;
  XML_Char *s;
  int local_40;
  int len_1;
  int i_1;
  int len;
  int i;
  XML_Bool needSep;
  HASH_TABLE_ITER iter;
  DTD *dtd;
  XML_Parser parser_local;
  
  iter.end = (NAMED **)parser->m_dtd;
  bVar3 = false;
  if ((((DTD *)iter.end)->defaultPrefix).binding != (BINDING *)0x0) {
    if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
       (XVar4 = poolGrow(&parser->m_tempPool), XVar4 == '\0')) {
      return (XML_Char *)0x0;
    }
    pXVar2 = (parser->m_tempPool).ptr;
    (parser->m_tempPool).ptr = pXVar2 + 1;
    *pXVar2 = '=';
    len_1 = *(int *)&iter.end[0x22][5].name;
    if (parser->m_namespaceSeparator != '\0') {
      len_1 = len_1 + -1;
    }
    for (i_1 = 0; i_1 < len_1; i_1 = i_1 + 1) {
      if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
         (XVar4 = poolGrow(&parser->m_tempPool), XVar4 == '\0')) {
        return (XML_Char *)0x0;
      }
      XVar1 = iter.end[0x22][4].name[i_1];
      pXVar2 = (parser->m_tempPool).ptr;
      (parser->m_tempPool).ptr = pXVar2 + 1;
      *pXVar2 = XVar1;
    }
    bVar3 = true;
  }
  hashTableIterInit((HASH_TABLE_ITER *)&i,(HASH_TABLE *)(iter.end + 0xf));
  while( true ) {
    do {
      pNVar5 = hashTableIterNext((HASH_TABLE_ITER *)&i);
      if (pNVar5 == (NAMED *)0x0) {
        hashTableIterInit((HASH_TABLE_ITER *)&i,(HASH_TABLE *)iter.end);
        do {
          do {
            pNVar5 = hashTableIterNext((HASH_TABLE_ITER *)&i);
            if (pNVar5 == (NAMED *)0x0) {
              if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
                 (XVar4 = poolGrow(&parser->m_tempPool), XVar4 == '\0')) {
                parser_local = (XML_Parser)0x0;
              }
              else {
                pXVar2 = (parser->m_tempPool).ptr;
                (parser->m_tempPool).ptr = pXVar2 + 1;
                *pXVar2 = '\0';
                parser_local = (XML_Parser)(parser->m_tempPool).start;
              }
              return (XML_Char *)parser_local;
            }
          } while (*(char *)&pNVar5[7].name == '\0');
          if (bVar3) {
            if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
               (XVar4 = poolGrow(&parser->m_tempPool), XVar4 == '\0')) {
              return (XML_Char *)0x0;
            }
            pXVar2 = (parser->m_tempPool).ptr;
            (parser->m_tempPool).ptr = pXVar2 + 1;
            *pXVar2 = '\f';
          }
          for (e = (ENTITY *)pNVar5->name; *(char *)&e->name != '\0';
              e = (ENTITY *)((long)&e->name + 1)) {
            if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
               (XVar4 = poolGrow(&parser->m_tempPool), XVar4 == '\0')) {
              return (XML_Char *)0x0;
            }
            XVar1 = *(XML_Char *)&e->name;
            pXVar2 = (parser->m_tempPool).ptr;
            (parser->m_tempPool).ptr = pXVar2 + 1;
            *pXVar2 = XVar1;
          }
          bVar3 = true;
        } while( true );
      }
    } while (pNVar5[1].name == (KEY)0x0);
    if (bVar3) {
      if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
         (XVar4 = poolGrow(&parser->m_tempPool), XVar4 == '\0')) {
        return (XML_Char *)0x0;
      }
      pXVar2 = (parser->m_tempPool).ptr;
      (parser->m_tempPool).ptr = pXVar2 + 1;
      *pXVar2 = '\f';
    }
    for (prefix = (PREFIX *)pNVar5->name; *(char *)&prefix->name != '\0';
        prefix = (PREFIX *)((long)&prefix->name + 1)) {
      if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
         (XVar4 = poolGrow(&parser->m_tempPool), XVar4 == '\0')) {
        return (XML_Char *)0x0;
      }
      XVar1 = *(XML_Char *)&prefix->name;
      pXVar2 = (parser->m_tempPool).ptr;
      (parser->m_tempPool).ptr = pXVar2 + 1;
      *pXVar2 = XVar1;
    }
    if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
       (XVar4 = poolGrow(&parser->m_tempPool), XVar4 == '\0')) break;
    pXVar2 = (parser->m_tempPool).ptr;
    (parser->m_tempPool).ptr = pXVar2 + 1;
    *pXVar2 = '=';
    s._4_4_ = *(int *)(pNVar5[1].name + 0x28);
    if (parser->m_namespaceSeparator != '\0') {
      s._4_4_ = s._4_4_ + -1;
    }
    for (local_40 = 0; local_40 < s._4_4_; local_40 = local_40 + 1) {
      if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
         (XVar4 = poolGrow(&parser->m_tempPool), XVar4 == '\0')) {
        return (XML_Char *)0x0;
      }
      XVar1 = *(XML_Char *)(*(long *)(pNVar5[1].name + 0x20) + (long)local_40);
      pXVar2 = (parser->m_tempPool).ptr;
      (parser->m_tempPool).ptr = pXVar2 + 1;
      *pXVar2 = XVar1;
    }
    bVar3 = true;
  }
  return (XML_Char *)0x0;
}

Assistant:

static const XML_Char *
getContext(XML_Parser parser)
{
  DTD * const dtd = parser->m_dtd;  /* save one level of indirection */
  HASH_TABLE_ITER iter;
  XML_Bool needSep = XML_FALSE;

  if (dtd->defaultPrefix.binding) {
    int i;
    int len;
    if (!poolAppendChar(&parser->m_tempPool, XML_T(ASCII_EQUALS)))
      return NULL;
    len = dtd->defaultPrefix.binding->uriLen;
    if (parser->m_namespaceSeparator)
      len--;
    for (i = 0; i < len; i++) {
      if (!poolAppendChar(&parser->m_tempPool, dtd->defaultPrefix.binding->uri[i])) {
        /* Because of memory caching, I don't believe this line can be
         * executed.
         *
         * This is part of a loop copying the default prefix binding
         * URI into the parser's temporary string pool.  Previously,
         * that URI was copied into the same string pool, with a
         * terminating NUL character, as part of setContext().  When
         * the pool was cleared, that leaves a block definitely big
         * enough to hold the URI on the free block list of the pool.
         * The URI copy in getContext() therefore cannot run out of
         * memory.
         *
         * If the pool is used between the setContext() and
         * getContext() calls, the worst it can do is leave a bigger
         * block on the front of the free list.  Given that this is
         * all somewhat inobvious and program logic can be changed, we
         * don't delete the line but we do exclude it from the test
         * coverage statistics.
         */
        return NULL; /* LCOV_EXCL_LINE */
      }
    }
    needSep = XML_TRUE;
  }

  hashTableIterInit(&iter, &(dtd->prefixes));
  for (;;) {
    int i;
    int len;
    const XML_Char *s;
    PREFIX *prefix = (PREFIX *)hashTableIterNext(&iter);
    if (!prefix)
      break;
    if (!prefix->binding) {
      /* This test appears to be (justifiable) paranoia.  There does
       * not seem to be a way of injecting a prefix without a binding
       * that doesn't get errored long before this function is called.
       * The test should remain for safety's sake, so we instead
       * exclude the following line from the coverage statistics.
       */
      continue; /* LCOV_EXCL_LINE */
    }
    if (needSep && !poolAppendChar(&parser->m_tempPool, CONTEXT_SEP))
      return NULL;
    for (s = prefix->name; *s; s++)
      if (!poolAppendChar(&parser->m_tempPool, *s))
        return NULL;
    if (!poolAppendChar(&parser->m_tempPool, XML_T(ASCII_EQUALS)))
      return NULL;
    len = prefix->binding->uriLen;
    if (parser->m_namespaceSeparator)
      len--;
    for (i = 0; i < len; i++)
      if (!poolAppendChar(&parser->m_tempPool, prefix->binding->uri[i]))
        return NULL;
    needSep = XML_TRUE;
  }


  hashTableIterInit(&iter, &(dtd->generalEntities));
  for (;;) {
    const XML_Char *s;
    ENTITY *e = (ENTITY *)hashTableIterNext(&iter);
    if (!e)
      break;
    if (!e->open)
      continue;
    if (needSep && !poolAppendChar(&parser->m_tempPool, CONTEXT_SEP))
      return NULL;
    for (s = e->name; *s; s++)
      if (!poolAppendChar(&parser->m_tempPool, *s))
        return 0;
    needSep = XML_TRUE;
  }

  if (!poolAppendChar(&parser->m_tempPool, XML_T('\0')))
    return NULL;
  return parser->m_tempPool.start;
}